

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O3

string * __thiscall
cppcms::rpc::json_rpc_server::method_abi_cxx11_
          (string *__return_storage_ptr__,json_rpc_server *this)

{
  element_type *peVar1;
  pointer pcVar2;
  
  check_call(this);
  peVar1 = (this->current_call_).
           super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (peVar1->method_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (peVar1->method_)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string json_rpc_server::method()
	{
		check_call();
		return current_call_->method();
	}